

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O3

bool __thiscall DTreeParenthoodPropagator::propagateRemEdge(DTreeParenthoodPropagator *this,int e)

{
  Tint *pTVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  undefined4 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  size_t __size;
  IntVar *pIVar12;
  int *pt;
  ulong uVar13;
  Clause *pCVar14;
  Clause *c;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  Clause *local_38;
  
  bVar7 = DReachabilityPropagator::propagateRemEdge((DReachabilityPropagator *)this,e);
  if (bVar7) {
    puVar4 = *(uint **)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                        super_GraphPropagator.endnodes.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[e].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
    uVar8 = *puVar4;
    uVar2 = puVar4[1];
    pIVar12 = (this->parents).data[uVar2];
    if (((pIVar12->min).v <= (int)uVar8) && ((int)uVar8 <= (pIVar12->max).v)) {
      lVar10 = (long)(int)uVar8;
      if (pIVar12->vals == (Tchar *)0x0) {
        if (uVar2 == uVar8) {
          return bVar7;
        }
      }
      else {
        if (uVar2 == uVar8) {
          return bVar7;
        }
        if (pIVar12->vals[lVar10].v == '\0') {
          return bVar7;
        }
      }
      if (so.lazy == true) {
        local_48 = (undefined1  [8])0x0;
        uStack_40 = (Lit *)0x0;
        vec<Lit>::push((vec<Lit> *)local_48);
        uVar8 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.es
                .data[(uint)e].v;
        local_38 = (Clause *)
                   CONCAT44(local_38._4_4_,
                            (uint)((int)sat.assigns.data[uVar8] - 1U < 0xfffffffd) + uVar8 * 2);
        vec<Lit>::push((vec<Lit> *)local_48,(Lit *)&local_38);
        uVar6 = local_48._0_4_;
        uVar13 = (ulong)local_48 & 0xffffffff;
        __size = 8;
        if (local_48._0_4_ != 0) {
          __size = (ulong)(local_48._0_4_ - 1) * 4 + 8;
        }
        local_38 = (Clause *)malloc(__size);
        uVar8 = uVar6 << 8;
        local_38->data[0].x = -2;
        *(uint *)local_38 = uVar8;
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            local_38->data[uVar11].x = uStack_40[uVar11].x;
            uVar11 = uVar11 + 1;
          } while (uVar13 != uVar11);
        }
        *(uint *)local_38 = uVar8 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
        pCVar14 = local_38;
        if (uStack_40 != (Lit *)0x0) {
          free(uStack_40);
        }
        piVar5 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
                 endnodes.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[e].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pIVar12 = (this->parents).data[(uint)piVar5[1]];
        lVar10 = (long)*piVar5;
      }
      else {
        pCVar14 = (Clause *)0x0;
      }
      iVar9 = 1;
      (*(pIVar12->super_Var).super_Branching._vptr_Branching[0x11])(pIVar12,lVar10,pCVar14,1);
      uVar8 = *(uint *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                  super_GraphPropagator.endnodes.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[e].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 4);
      pIVar12 = (this->parents).data[uVar8];
      uVar2 = (pIVar12->min).v;
      uVar3 = (pIVar12->max).v;
      if (uVar2 != uVar3) {
        iVar9 = 2;
        if ((int)((long)(int)uVar2 + 1) < (int)uVar3) {
          lVar10 = 0;
          do {
            iVar9 = iVar9 + pIVar12->vals[lVar10 + (long)(int)uVar2 + 1].v;
            lVar10 = lVar10 + 1;
          } while (~uVar2 + uVar3 != (int)lVar10);
        }
      }
      pTVar1 = this->dom_size + (int)uVar8;
      uStack_40 = (Lit *)CONCAT44(4,pTVar1->v);
      local_48 = (undefined1  [8])pTVar1;
      vec<TrailElem>::push(&engine.trail,(TrailElem *)local_48);
      pTVar1->v = iVar9;
    }
  }
  return bVar7;
}

Assistant:

bool DTreeParenthoodPropagator::propagateRemEdge(int e) {
	assert(getEdgeVar(e).isFixed());
	assert(getEdgeVar(e).isFalse());

	if (!DTreePropagator::propagateRemEdge(e)) {
		return false;
	}

	// If tail of e is the only possible parent of head of e
	// fail (unless head of e is the root)
	// Otherwise remove that value and that's it.
	if (parents[getHead(e)]->indomain(getTail(e))) {
		if (getHead(e) == getTail(e)) {
			return true;
		}
		Clause* r = nullptr;
		if (so.lazy) {
			vec<Lit> ps;
			ps.push();
			ps.push(getEdgeVar(e).getValLit());
			r = Reason_new(ps);
		}
		parents[getHead(e)]->remVal(getTail(e), r);
		if (DEBUG) {
			std::cout << "This guy " << getHead(e) << " cannot have " << getTail(e)
								<< " as a parent, because I removed edge" << e << '\n';
		}
		assert(parents[getHead(e)]->size() > 0);
		dom_size[getHead(e)] = parents[getHead(e)]->size();
	}

	return true;
}